

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

void jsoncons::detail::fill_exponent<jsoncons::stream_sink<char>>(int K,stream_sink<char> *result)

{
  byte bVar1;
  uint uVar2;
  
  if (K < 0) {
    stream_sink<char>::push_back(result,'-');
    K = -K;
  }
  else {
    stream_sink<char>::push_back(result,'+');
  }
  bVar1 = (byte)K;
  if ((uint)K < 10) {
    stream_sink<char>::push_back(result,'0');
  }
  else {
    if ((uint)K < 100) {
      uVar2 = K & 0xff;
      bVar1 = (byte)(uVar2 / 10);
      stream_sink<char>::push_back(result,bVar1 | 0x30);
    }
    else {
      if (999 < (uint)K) {
        from_integer<int,jsoncons::stream_sink<char>>(K,result);
        return;
      }
      uVar2 = (K & 0xffffU) / 100;
      stream_sink<char>::push_back(result,(byte)uVar2 | 0x30);
      uVar2 = K + uVar2 * -100;
      bVar1 = (byte)((uVar2 * 0x67 & 0xffff) >> 10);
      stream_sink<char>::push_back(result,bVar1 | 0x30);
    }
    bVar1 = (char)uVar2 + bVar1 * -10;
  }
  stream_sink<char>::push_back(result,bVar1 | 0x30);
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }